

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::Server::set_mount_point(Server *this,string *mount_point,string *dir,Headers *headers)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  _Rb_tree_impl<httplib::detail::ci,_true> *p_Var5;
  int iVar6;
  stat st;
  long *local_e0;
  long local_d8;
  long local_d0 [2];
  undefined1 local_c0 [32];
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  
  iVar6 = stat((dir->_M_dataplus)._M_p,(stat *)local_c0);
  if ((-1 < iVar6) && ((local_c0._24_4_ & 0xf000) == 0x4000)) {
    local_e0 = local_d0;
    if (mount_point->_M_string_length == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"/","");
    }
    else {
      pcVar2 = (mount_point->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,pcVar2,pcVar2 + mount_point->_M_string_length);
    }
    bVar4 = true;
    if ((local_d8 != 0) && ((char)*local_e0 == '/')) {
      local_c0._0_8_ = local_c0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c0,local_e0,(char *)((long)local_e0 + local_d8));
      pcVar2 = (dir->_M_dataplus)._M_p;
      local_a0._M_p = (pointer)&local_90;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,pcVar2,pcVar2 + dir->_M_string_length);
      local_80._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_80._M_impl.super__Rb_tree_header._M_header;
      local_80._M_impl.super__Rb_tree_header._M_header._M_parent =
           (headers->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (local_80._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
        p_Var5 = &local_80._M_impl;
        local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_80._M_impl.super__Rb_tree_header._M_header._M_right =
             local_80._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      else {
        p_Var1 = &(headers->_M_t)._M_impl.super__Rb_tree_header;
        local_80._M_impl.super__Rb_tree_header._M_header._M_color =
             (headers->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color;
        p_Var3 = (headers->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        local_80._M_impl.super__Rb_tree_header._M_header._M_right =
             (headers->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_80._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             local_80._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var5 = &(headers->_M_t)._M_impl;
        local_80._M_impl.super__Rb_tree_header._M_node_count =
             (headers->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
        (headers->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        (headers->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        (headers->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        local_80._M_impl.super__Rb_tree_header._M_header._M_left = p_Var3;
      }
      (p_Var5->super__Rb_tree_header)._M_node_count = 0;
      std::
      vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>::
      emplace_back<httplib::Server::MountPointEntry>(&this->base_dirs_,(MountPointEntry *)local_c0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_p != &local_90) {
        operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
        operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
      }
      bVar4 = false;
    }
    if (local_e0 != local_d0) {
      operator_delete(local_e0,local_d0[0] + 1);
    }
    if (!bVar4) {
      return true;
    }
  }
  return false;
}

Assistant:

inline bool Server::set_mount_point(const std::string &mount_point,
                                    const std::string &dir, Headers headers) {
  if (detail::is_dir(dir)) {
    std::string mnt = !mount_point.empty() ? mount_point : "/";
    if (!mnt.empty() && mnt[0] == '/') {
      base_dirs_.push_back({mnt, dir, std::move(headers)});
      return true;
    }
  }
  return false;
}